

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderLoader.cpp
# Opt level: O0

void __thiscall
Assimp::BlenderImporter::ResolveImage
          (BlenderImporter *this,aiMaterial *out,Material *mat,MTex *tex,Image *img,
          ConversionData *conv_data)

{
  MapType MVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  mywrap *pmVar5;
  size_type sVar6;
  aiTexture *this_00;
  reference ppaVar7;
  element_type *peVar8;
  element_type *peVar9;
  element_type *peVar10;
  element_type *peVar11;
  undefined1 local_a98;
  undefined1 local_a94;
  undefined1 local_a90;
  uint local_a68;
  MapType map_type;
  aiTextureType texture_type;
  aiString local_a40;
  allocator local_629;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_628;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_608;
  format local_5e8;
  void *local_470;
  uint8_t *ch;
  char *e;
  char *s;
  size_t nlen;
  aiTexture *tex_1;
  undefined1 local_43c [8];
  aiString name;
  ConversionData *conv_data_local;
  Image *img_local;
  MTex *tex_local;
  Material *mat_local;
  aiMaterial *out_local;
  BlenderImporter *this_local;
  
  name.data._1016_8_ = conv_data;
  aiString::aiString((aiString *)local_43c);
  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&img->packedfile);
  if (bVar2) {
    local_43c[4] = '*';
    pmVar5 = Blender::TempArray<std::vector,_aiTexture>::operator->
                       ((TempArray<std::vector,_aiTexture> *)(name.data._1016_8_ + 0x90));
    sVar6 = std::vector<aiTexture_*,_std::allocator<aiTexture_*>_>::size(pmVar5);
    uVar3 = ASSIMP_itoa10(local_43c + 5,0x3ff,(int32_t)sVar6);
    local_43c._0_4_ = uVar3 + 1;
    pmVar5 = Blender::TempArray<std::vector,_aiTexture>::operator->
                       ((TempArray<std::vector,_aiTexture> *)(name.data._1016_8_ + 0x90));
    this_00 = (aiTexture *)operator_new(0x428);
    aiTexture::aiTexture(this_00);
    tex_1 = this_00;
    std::vector<aiTexture_*,_std::allocator<aiTexture_*>_>::push_back(pmVar5,&tex_1);
    pmVar5 = Blender::TempArray<std::vector,_aiTexture>::operator->
                       ((TempArray<std::vector,_aiTexture> *)(name.data._1016_8_ + 0x90));
    ppaVar7 = std::vector<aiTexture_*,_std::allocator<aiTexture_*>_>::back(pmVar5);
    nlen = (size_t)*ppaVar7;
    s = (char *)strlen(img->name);
    ch = (uint8_t *)(img->name + (long)s);
    e = (char *)ch;
    while( true ) {
      bVar2 = false;
      if (img->name <= e) {
        bVar2 = *e != '.';
      }
      if (!bVar2) break;
      e = e + -1;
    }
    if (ch < e + 1) {
      local_a90 = 0;
    }
    else {
      iVar4 = tolower((int)e[1]);
      local_a90 = (undefined1)iVar4;
    }
    *(undefined1 *)(nlen + 8) = local_a90;
    if (ch < e + 2) {
      local_a94 = 0;
    }
    else {
      iVar4 = tolower((int)e[2]);
      local_a94 = (undefined1)iVar4;
    }
    *(undefined1 *)(nlen + 9) = local_a94;
    if (ch < e + 3) {
      local_a98 = 0;
    }
    else {
      iVar4 = tolower((int)e[3]);
      local_a98 = (undefined1)iVar4;
    }
    *(undefined1 *)(nlen + 10) = local_a98;
    *(undefined1 *)(nlen + 0xb) = 0;
    peVar8 = std::
             __shared_ptr_access<Assimp::Blender::PackedFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<Assimp::Blender::PackedFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&img->packedfile);
    *(int *)nlen = peVar8->size;
    local_470 = operator_new__((ulong)*(uint *)nlen);
    peVar9 = std::
             __shared_ptr_access<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)(*(long *)(name.data._1016_8_ + 0x148) + 0x80));
    peVar8 = std::
             __shared_ptr_access<Assimp::Blender::PackedFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<Assimp::Blender::PackedFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&img->packedfile);
    peVar10 = std::
              __shared_ptr_access<Assimp::Blender::FileOffset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<Assimp::Blender::FileOffset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&peVar8->data);
    StreamReader<true,_true>::SetCurrentPos(peVar9,peVar10->val);
    peVar9 = std::
             __shared_ptr_access<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)(*(long *)(name.data._1016_8_ + 0x148) + 0x80));
    StreamReader<true,_true>::CopyAndAdvance(peVar9,local_470,(ulong)*(uint *)nlen);
    *(void **)(nlen + 0x18) = local_470;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_628,img->name,&local_629);
    std::operator+(&local_608,"Reading embedded texture, original file was ",&local_628);
    Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
    basic_formatter<std::__cxx11::string>
              ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)&local_5e8,
               &local_608);
    LogFunctions<Assimp::BlenderImporter>::LogInfo(&local_5e8);
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    ~basic_formatter(&local_5e8);
    std::__cxx11::string::~string((string *)&local_608);
    std::__cxx11::string::~string((string *)&local_628);
    std::allocator<char>::~allocator((allocator<char> *)&local_629);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&texture_type,img->name,(allocator *)((long)&map_type + 3));
    aiString::aiString(&local_a40,(string *)&texture_type);
    aiString::operator=((aiString *)local_43c,&local_a40);
    std::__cxx11::string::~string((string *)&texture_type);
    std::allocator<char>::~allocator((allocator<char> *)((long)&map_type + 3));
  }
  local_a68 = 0x12;
  MVar1 = tex->mapto;
  if ((MVar1 & MapType_COL) == 0) {
    if ((MVar1 & MapType_NORM) == 0) {
      if ((MVar1 & MapType_COLSPEC) == 0) {
        if ((MVar1 & MapType_COLMIR) == 0) {
          if ((MVar1 & MapType_SPEC) == 0) {
            if ((MVar1 & MapType_EMIT) == 0) {
              if ((MVar1 & MapType_AMB) == 0) {
                if ((MVar1 & MapType_DISPLACE) != 0) {
                  local_a68 = 9;
                }
              }
              else {
                local_a68 = 3;
              }
            }
            else {
              local_a68 = 4;
            }
          }
          else {
            local_a68 = 7;
          }
        }
        else {
          local_a68 = 0xb;
        }
      }
      else {
        local_a68 = 2;
      }
    }
    else {
      peVar11 = std::
                __shared_ptr_access<Assimp::Blender::Tex,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<Assimp::Blender::Tex,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&tex->tex);
      if ((peVar11->imaflag & ImageFlags_NORMALMAP) == 0) {
        local_a68 = 5;
      }
      else {
        local_a68 = 6;
      }
      aiMaterial::AddProperty(out,&tex->norfac,1,"$mat.bumpscaling",0,0);
    }
  }
  else {
    local_a68 = 1;
  }
  uVar3 = *(uint *)(name.data._1016_8_ + 0xfc + (ulong)local_a68 * 4);
  *(uint *)(name.data._1016_8_ + 0xfc + (ulong)local_a68 * 4) = uVar3 + 1;
  aiMaterial::AddProperty(out,(aiString *)local_43c,"$tex.file",local_a68,uVar3);
  return;
}

Assistant:

void BlenderImporter::ResolveImage(aiMaterial* out, const Material* mat, const MTex* tex, const Image* img, ConversionData& conv_data)
{
    (void)mat; (void)tex; (void)conv_data;
    aiString name;

    // check if the file contents are bundled with the BLEND file
    if (img->packedfile) {
        name.data[0] = '*';
        name.length = 1+ ASSIMP_itoa10(name.data+1,static_cast<unsigned int>(MAXLEN-1), static_cast<int32_t>(conv_data.textures->size()));

        conv_data.textures->push_back(new aiTexture());
        aiTexture* tex = conv_data.textures->back();

        // usually 'img->name' will be the original file name of the embedded textures,
        // so we can extract the file extension from it.
        const size_t nlen = strlen( img->name );
        const char* s = img->name+nlen, *e = s;
        while ( s >= img->name && *s != '.' ) {
            --s;
        }

        tex->achFormatHint[0] = s+1>e ? '\0' : ::tolower( s[1] );
        tex->achFormatHint[1] = s+2>e ? '\0' : ::tolower( s[2] );
        tex->achFormatHint[2] = s+3>e ? '\0' : ::tolower( s[3] );
        tex->achFormatHint[3] = '\0';

        // tex->mHeight = 0;
        tex->mWidth = img->packedfile->size;
        uint8_t* ch = new uint8_t[tex->mWidth];

        conv_data.db.reader->SetCurrentPos(static_cast<size_t>( img->packedfile->data->val));
        conv_data.db.reader->CopyAndAdvance(ch,tex->mWidth);

        tex->pcData = reinterpret_cast<aiTexel*>(ch);

        LogInfo("Reading embedded texture, original file was "+std::string(img->name));
    } else {
        name = aiString( img->name );
    }

    aiTextureType texture_type = aiTextureType_UNKNOWN;
    MTex::MapType map_type = tex->mapto;

    if (map_type & MTex::MapType_COL)
        texture_type = aiTextureType_DIFFUSE;
    else if (map_type & MTex::MapType_NORM) {
        if (tex->tex->imaflag & Tex::ImageFlags_NORMALMAP) {
            texture_type = aiTextureType_NORMALS;
        }
        else {
            texture_type = aiTextureType_HEIGHT;
        }
        out->AddProperty(&tex->norfac,1,AI_MATKEY_BUMPSCALING);
    }
    else if (map_type & MTex::MapType_COLSPEC)
        texture_type = aiTextureType_SPECULAR;
    else if (map_type & MTex::MapType_COLMIR)
        texture_type = aiTextureType_REFLECTION;
    //else if (map_type & MTex::MapType_REF)
    else if (map_type & MTex::MapType_SPEC)
        texture_type = aiTextureType_SHININESS;
    else if (map_type & MTex::MapType_EMIT)
        texture_type = aiTextureType_EMISSIVE;
    //else if (map_type & MTex::MapType_ALPHA)
    //else if (map_type & MTex::MapType_HAR)
    //else if (map_type & MTex::MapType_RAYMIRR)
    //else if (map_type & MTex::MapType_TRANSLU)
    else if (map_type & MTex::MapType_AMB)
        texture_type = aiTextureType_AMBIENT;
    else if (map_type & MTex::MapType_DISPLACE)
        texture_type = aiTextureType_DISPLACEMENT;
    //else if (map_type & MTex::MapType_WARP)

    out->AddProperty(&name,AI_MATKEY_TEXTURE(texture_type,
        conv_data.next_texture[texture_type]++));

}